

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_latency.cpp
# Opt level: O2

void __thiscall cubeb_latency_Test::TestBody(cubeb_latency_Test *this)

{
  int iVar1;
  cubeb_stream_params *pcVar2;
  cubeb *context;
  String *this_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *pcVar3;
  String *pSVar4;
  AssertionResult *this_02;
  int r;
  uint32_t preferred_rate;
  uint32_t max_channels;
  AssertionResult gtest_ar;
  String local_1f8;
  cubeb *ctx;
  uint32_t latency_frames;
  AssertionResult gtest_ar__2;
  undefined1 local_1b8 [8];
  cubeb_stream_params params;
  
  ctx = (cubeb *)0x0;
  r = common_init(&ctx,"Cubeb audio test");
  if (r == 0) {
    testing::AssertionSuccess();
  }
  else {
    testing::PrintToString<int>((string *)&params,&r);
    testing::internal::String::String(&local_1f8,(string *)&params);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::stringstream::stringstream((stringstream *)&params);
    std::ostream::_M_insert<long_long>((longlong)&params.prefs);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&params);
    testing::internal::String::String((String *)&params,(string *)&gtest_ar__2);
    std::__cxx11::string::_M_dispose();
    testing::internal::EqFailure
              ((internal *)&gtest_ar,"r","CUBEB_OK",&local_1f8,(String *)&params,false);
    testing::internal::String::~String((String *)&params);
    testing::internal::String::~String(&local_1f8);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&params);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
               ,0x12,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&params);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&params);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  context = ctx;
  r = cubeb_get_max_channel_count(ctx,&max_channels);
  this_01 = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&params.channels;
  params.channels = 0;
  params.layout = 0;
  params.format = CONCAT31(params.format._1_3_,r == -4 || r == 0);
  if ((r != -4) && (r != 0)) {
    this_00 = &local_1f8;
    testing::Message::Message((Message *)this_00);
    pSVar4 = (String *)&gtest_ar__2;
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)pSVar4,(AssertionResult *)&params,
               "r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED","false","true");
    pcVar3 = (char *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_);
    this_02 = &gtest_ar;
    iVar1 = 0x18;
    goto LAB_001074e1;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_01);
  if (r == 0) {
    gtest_ar__2.success_ = false;
    gtest_ar__2._1_3_ = 0;
    testing::internal::CmpHelperGT<unsigned_int,unsigned_int>
              ((internal *)&params,"max_channels","0u",&max_channels,(uint *)&gtest_ar__2);
    if ((undefined1)params.format != CUBEB_SAMPLE_S16LE) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&params.channels);
      goto LAB_00107244;
    }
    testing::Message::Message((Message *)&gtest_ar__2);
    if ((undefined8 *)CONCAT44(params.layout,params.channels) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(params.layout,params.channels);
    }
    iVar1 = 0x1a;
LAB_00107577:
    pSVar4 = &local_1f8;
    pcVar2 = &params;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)pSVar4,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
               ,iVar1,pcVar3);
    this_00 = (String *)&gtest_ar__2;
LAB_00107585:
    this_01 = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pcVar2->channels;
    testing::internal::AssertHelper::operator=((AssertHelper *)pSVar4,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pSVar4);
LAB_0010759b:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_00);
  }
  else {
LAB_00107244:
    r = cubeb_get_preferred_sample_rate(ctx,&preferred_rate);
    this_01 = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&params.channels;
    params.channels = 0;
    params.layout = 0;
    params.format = CONCAT31(params.format._1_3_,r == -4 || r == 0);
    if ((r != -4) && (r != 0)) {
      this_00 = &local_1f8;
      testing::Message::Message((Message *)this_00);
      pSVar4 = (String *)&gtest_ar__2;
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)pSVar4,(AssertionResult *)&params,
                 "r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED","false","true");
      pcVar3 = (char *)CONCAT44(gtest_ar__2._4_4_,gtest_ar__2._0_4_);
      this_02 = &gtest_ar;
      iVar1 = 0x1e;
LAB_001074e1:
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_02,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
                 ,iVar1,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_02,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
      testing::internal::String::~String(pSVar4);
      goto LAB_0010759b;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(this_01);
    if (r == 0) {
      gtest_ar__2.success_ = false;
      gtest_ar__2._1_3_ = 0;
      testing::internal::CmpHelperGT<unsigned_int,unsigned_int>
                ((internal *)&params,"preferred_rate","0u",&preferred_rate,(uint *)&gtest_ar__2);
      if ((undefined1)params.format == CUBEB_SAMPLE_S16LE) {
        testing::Message::Message((Message *)&gtest_ar__2);
        if ((undefined8 *)CONCAT44(params.layout,params.channels) == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)CONCAT44(params.layout,params.channels);
        }
        iVar1 = 0x20;
        goto LAB_00107577;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&params.channels);
    }
    params.format = CUBEB_SAMPLE_FLOAT32LE;
    params.rate = preferred_rate;
    params.channels = max_channels;
    params.layout = 0;
    params.prefs = CUBEB_STREAM_PREF_NONE;
    r = cubeb_get_min_latency(ctx,&params,&latency_frames);
    this_01 = &gtest_ar__2.message_;
    gtest_ar__2.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar__2.success_ = r == -4 || r == 0;
    if ((r != -4) && (r != 0)) {
      this_00 = (String *)&gtest_ar;
      testing::Message::Message((Message *)this_00);
      pSVar4 = &local_1f8;
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)pSVar4,&gtest_ar__2,"r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED",
                 "false","true");
      pcVar3 = (char *)CONCAT44(local_1f8.c_str_._4_4_,local_1f8.c_str_._0_4_);
      this_02 = (AssertionResult *)local_1b8;
      iVar1 = 0x2b;
      goto LAB_001074e1;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(this_01);
    if (r != 0) goto LAB_001075a8;
    local_1f8.c_str_._0_4_ = 0;
    testing::internal::CmpHelperGT<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar__2,"latency_frames","0u",&latency_frames,(uint *)&local_1f8);
    if (gtest_ar__2.success_ == false) {
      testing::Message::Message((Message *)&local_1f8);
      pcVar2 = (cubeb_stream_params *)&gtest_ar__2;
      if (gtest_ar__2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar__2.message_.ptr_)->_M_dataplus)._M_p;
      }
      pSVar4 = (String *)&gtest_ar;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)pSVar4,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_latency.cpp"
                 ,0x2d,pcVar3);
      this_00 = &local_1f8;
      goto LAB_00107585;
    }
    this_01 = &gtest_ar__2.message_;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_01);
LAB_001075a8:
  if (context != (cubeb *)0x0) {
    cubeb_destroy(context);
  }
  return;
}

Assistant:

TEST(cubeb, latency)
{
  cubeb * ctx = NULL;
  int r;
  uint32_t max_channels;
  uint32_t preferred_rate;
  uint32_t latency_frames;

  r = common_init(&ctx, "Cubeb audio test");
  ASSERT_EQ(r, CUBEB_OK);

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)>
    cleanup_cubeb_at_exit(ctx, cubeb_destroy);

  r = cubeb_get_max_channel_count(ctx, &max_channels);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_GT(max_channels, 0u);
  }

  r = cubeb_get_preferred_sample_rate(ctx, &preferred_rate);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_GT(preferred_rate, 0u);
  }

  cubeb_stream_params params = {
    CUBEB_SAMPLE_FLOAT32NE,
    preferred_rate,
    max_channels,
    CUBEB_LAYOUT_UNDEFINED,
    CUBEB_STREAM_PREF_NONE
  };
  r = cubeb_get_min_latency(ctx, &params, &latency_frames);
  ASSERT_TRUE(r == CUBEB_OK || r == CUBEB_ERROR_NOT_SUPPORTED);
  if (r == CUBEB_OK) {
    ASSERT_GT(latency_frames, 0u);
  }
}